

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,OpType *args_1,
          shared_ptr<mocker::ir::Addr> *args_2,shared_ptr<mocker::ir::Addr> *args_3)

{
  shared_ptr<mocker::ir::IRInst> local_50;
  undefined1 local_40 [8];
  shared_ptr<mocker::ir::ArithBinaryInst> inst;
  shared_ptr<mocker::ir::Addr> *args_local_3;
  shared_ptr<mocker::ir::Addr> *args_local_2;
  OpType *args_local_1;
  shared_ptr<mocker::ir::Reg> *args_local;
  BuilderContext *this_local;
  
  inst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_3;
  std::
  make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>>
            ((shared_ptr<mocker::ir::Reg> *)local_40,(OpType *)args,
             (shared_ptr<mocker::ir::Addr> *)args_1,args_2);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::ArithBinaryInst,void>
            (&local_50,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_40);
  appendInst(this,&local_50);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_50);
  std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
            ((shared_ptr<mocker::ir::ArithBinaryInst> *)local_40);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }